

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineHuge.cpp
# Opt level: O3

void anon_unknown.dwarf_11c769::readWriteTest
               (int channelCount,int testTimes,bool random_channel_data,string *fn)

{
  int j_2;
  ostream *poVar1;
  int j;
  int k;
  int j_1;
  Array<Imf_3_2::Array2D<void_*>_> data;
  DeepScanLineOutputFile file;
  int type;
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing files with ",0x13);
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," channels ",10);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," times.",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::ostream::flush();
  (*(code *)&UNK_00152fcd)();
  return;
}

Assistant:

void
readWriteTest (
    int                channelCount,
    int                testTimes,
    bool               random_channel_data,
    const std::string& fn)
{
    cout << "Testing files with " << channelCount << " channels " << testTimes
         << " times." << endl
         << flush;
    for (int i = 0; i < testTimes; i++)
    {
        int         compressionIndex = i % 3;
        Compression compression;
        switch (compressionIndex)
        {
            case 0: compression = NO_COMPRESSION; break;
            case 1: compression = RLE_COMPRESSION; break;
            case 2: compression = ZIPS_COMPRESSION; break;
        }

        generateRandomFile (channelCount, compression, random_channel_data, fn);
        readFile (channelCount, false, fn);
        remove (fn.c_str ());
    }
}